

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O0

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_1> *alhs,
          const_blas_data_mapper<double,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  long lVar1;
  double dVar2;
  long lVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dc_39;
  undefined4 extraout_XMM0_Dc_40;
  undefined4 extraout_XMM0_Dc_41;
  undefined4 extraout_XMM0_Dc_42;
  undefined4 extraout_XMM0_Dc_43;
  undefined4 extraout_XMM0_Dc_44;
  undefined4 extraout_XMM0_Dc_45;
  undefined4 extraout_XMM0_Dc_46;
  undefined4 extraout_XMM0_Dc_47;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  undefined4 extraout_XMM0_Dd_23;
  undefined4 extraout_XMM0_Dd_24;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined4 extraout_XMM0_Dd_35;
  undefined4 extraout_XMM0_Dd_36;
  undefined4 extraout_XMM0_Dd_37;
  undefined4 extraout_XMM0_Dd_38;
  undefined4 extraout_XMM0_Dd_39;
  undefined4 extraout_XMM0_Dd_40;
  undefined4 extraout_XMM0_Dd_41;
  undefined4 extraout_XMM0_Dd_42;
  undefined4 extraout_XMM0_Dd_43;
  undefined4 extraout_XMM0_Dd_44;
  undefined4 extraout_XMM0_Dd_45;
  undefined4 extraout_XMM0_Dd_46;
  undefined4 extraout_XMM0_Dd_47;
  Packet2d adVar4;
  double adVar5 [2];
  long local_a28;
  double local_a20;
  ResScalar cc0_3;
  undefined1 auStack_a08 [8];
  RhsPacket b0_6;
  long j_3;
  undefined1 auStack_9e8 [8];
  ResPacket c0_3;
  double local_9d0;
  double b0_5;
  ResScalar cc1_2;
  ResScalar cc0_2;
  double local_9a8 [2];
  undefined1 auStack_998 [8];
  RhsPacket b0_4;
  long j_2;
  undefined1 auStack_978 [8];
  ResPacket c1_2;
  double local_960;
  undefined1 auStack_958 [8];
  ResPacket c0_2;
  double local_940;
  double b0_3;
  ResScalar cc3_1;
  ResScalar cc2_1;
  ResScalar cc1_1;
  ResScalar cc0_1;
  double local_908 [2];
  double local_8f8 [2];
  double local_8e8 [2];
  undefined1 auStack_8d8 [8];
  RhsPacket b0_2;
  long j_1;
  undefined1 auStack_8b8 [8];
  ResPacket c3_1;
  double local_8a0;
  undefined1 auStack_898 [8];
  ResPacket c2_1;
  double local_880;
  undefined1 auStack_878 [8];
  ResPacket c1_1;
  double local_860;
  undefined1 auStack_858 [8];
  ResPacket c0_1;
  double local_840;
  double b0_1;
  ResScalar cc7;
  ResScalar cc6;
  ResScalar cc5;
  ResScalar cc4;
  ResScalar cc3;
  ResScalar cc2;
  ResScalar cc1;
  ResScalar cc0;
  double local_7e8 [2];
  double local_7d8 [2];
  double local_7c8 [2];
  double local_7b8 [2];
  double local_7a8 [2];
  double local_798 [2];
  double local_788 [2];
  undefined1 auStack_778 [8];
  RhsPacket b0;
  long j;
  undefined1 auStack_758 [8];
  ResPacket c7;
  double local_740;
  undefined1 auStack_738 [8];
  ResPacket c6;
  double local_720;
  undefined1 auStack_718 [8];
  ResPacket c5;
  double local_700;
  undefined1 auStack_6f8 [8];
  ResPacket c4;
  double local_6e0;
  undefined1 auStack_6d8 [8];
  ResPacket c3;
  double local_6c0;
  undefined1 auStack_6b8 [8];
  ResPacket c2;
  double local_6a0;
  undefined1 auStack_698 [8];
  ResPacket c1;
  double local_680;
  undefined1 auStack_678 [8];
  ResPacket c0;
  long i;
  long n2;
  long n4;
  long n8;
  undefined1 auStack_640 [6];
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj;
  conj_helper<double,_double,_false,_false> cj;
  const_blas_data_mapper<double,_long,_1> lhs;
  ResScalar alpha_local;
  long resIncr_local;
  ResScalar *res_local;
  const_blas_data_mapper<double,_long,_0> *rhs_local;
  const_blas_data_mapper<double,_long,_1> *alhs_local;
  long cols_local;
  long rows_local;
  
  _auStack_640 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
  lVar1 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
  lVar3 = blas_data_mapper<const_double,_long,_1,_0>::stride
                    ((blas_data_mapper<const_double,_long,_1,_0> *)auStack_640);
  if ((ulong)(lVar3 * 8) < 0x7d01) {
    local_a28 = rows + -7;
  }
  else {
    local_a28 = 0;
  }
  for (c0[1] = 0.0; (long)c0[1] < local_a28; c0[1] = (double)((long)c0[1] + 8)) {
    local_680 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_680);
    unique0x10000640 = extraout_XMM0_Dc;
    auStack_678 = adVar4[0];
    unique0x10000644 = extraout_XMM0_Dd;
    local_6a0 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_6a0);
    unique0x10000664 = extraout_XMM0_Dc_00;
    auStack_698 = adVar4[0];
    unique0x10000668 = extraout_XMM0_Dd_00;
    local_6c0 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_6c0);
    unique0x10000688 = extraout_XMM0_Dc_01;
    auStack_6b8 = adVar4[0];
    unique0x1000068c = extraout_XMM0_Dd_01;
    local_6e0 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_6e0);
    unique0x100006ac = extraout_XMM0_Dc_02;
    auStack_6d8 = adVar4[0];
    unique0x100006b0 = extraout_XMM0_Dd_02;
    local_700 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_700);
    unique0x100006d0 = extraout_XMM0_Dc_03;
    auStack_6f8 = adVar4[0];
    unique0x100006d4 = extraout_XMM0_Dd_03;
    local_720 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_720);
    unique0x100006f4 = extraout_XMM0_Dc_04;
    auStack_718 = adVar4[0];
    unique0x100006f8 = extraout_XMM0_Dd_04;
    local_740 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_740);
    unique0x10000718 = extraout_XMM0_Dc_05;
    auStack_738 = adVar4[0];
    unique0x1000071c = extraout_XMM0_Dd_05;
    j = 0;
    adVar4 = pset1<double__vector(2)>((double *)&j);
    unique0x1000073c = extraout_XMM0_Dc_06;
    auStack_758 = adVar4[0];
    unique0x10000740 = extraout_XMM0_Dd_06;
    for (b0[1] = 0.0; (long)b0[1] + 2 <= cols; b0[1] = (double)((long)b0[1] + 2)) {
      adVar4 = ploadu<double__vector(2)>
                         ((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                          (long)b0[1]);
      unique0x10000760 = extraout_XMM0_Dc_07;
      auStack_778 = adVar4[0];
      unique0x10000764 = extraout_XMM0_Dd_07;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + (long)c0[1] * lVar1);
      local_788[1]._0_4_ = extraout_XMM0_Dc_08;
      local_788[0] = adVar4[0];
      local_788[1]._4_4_ = extraout_XMM0_Dd_08;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_788,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_678);
      unique0x100007a8 = extraout_XMM0_Dc_09;
      auStack_678 = adVar5[0];
      unique0x100007ac = extraout_XMM0_Dd_09;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + ((long)c0[1] + 1) * lVar1);
      local_798[1]._0_4_ = extraout_XMM0_Dc_10;
      local_798[0] = adVar4[0];
      local_798[1]._4_4_ = extraout_XMM0_Dd_10;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_798,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_698);
      unique0x100007f0 = extraout_XMM0_Dc_11;
      auStack_698 = adVar5[0];
      unique0x100007f4 = extraout_XMM0_Dd_11;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + ((long)c0[1] + 2) * lVar1);
      local_7a8[1]._0_4_ = extraout_XMM0_Dc_12;
      local_7a8[0] = adVar4[0];
      local_7a8[1]._4_4_ = extraout_XMM0_Dd_12;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_7a8,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_6b8);
      unique0x10000838 = extraout_XMM0_Dc_13;
      auStack_6b8 = adVar5[0];
      unique0x1000083c = extraout_XMM0_Dd_13;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + ((long)c0[1] + 3) * lVar1);
      local_7b8[1]._0_4_ = extraout_XMM0_Dc_14;
      local_7b8[0] = adVar4[0];
      local_7b8[1]._4_4_ = extraout_XMM0_Dd_14;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_7b8,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_6d8);
      unique0x10000880 = extraout_XMM0_Dc_15;
      auStack_6d8 = adVar5[0];
      unique0x10000884 = extraout_XMM0_Dd_15;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + ((long)c0[1] + 4) * lVar1);
      local_7c8[1]._0_4_ = extraout_XMM0_Dc_16;
      local_7c8[0] = adVar4[0];
      local_7c8[1]._4_4_ = extraout_XMM0_Dd_16;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_7c8,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_6f8);
      unique0x100008c8 = extraout_XMM0_Dc_17;
      auStack_6f8 = adVar5[0];
      unique0x100008cc = extraout_XMM0_Dd_17;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + ((long)c0[1] + 5) * lVar1);
      local_7d8[1]._0_4_ = extraout_XMM0_Dc_18;
      local_7d8[0] = adVar4[0];
      local_7d8[1]._4_4_ = extraout_XMM0_Dd_18;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_7d8,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_718);
      unique0x10000910 = extraout_XMM0_Dc_19;
      auStack_718 = adVar5[0];
      unique0x10000914 = extraout_XMM0_Dd_19;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + ((long)c0[1] + 6) * lVar1);
      local_7e8[1]._0_4_ = extraout_XMM0_Dc_20;
      local_7e8[0] = adVar4[0];
      local_7e8[1]._4_4_ = extraout_XMM0_Dd_20;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_7e8,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_738);
      unique0x10000958 = extraout_XMM0_Dc_21;
      auStack_738 = adVar5[0];
      unique0x1000095c = extraout_XMM0_Dd_21;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0[1] + ((long)c0[1] + 7) * lVar1);
      unique0x1000097c = extraout_XMM0_Dc_22;
      cc0 = adVar4[0];
      unique0x10000980 = extraout_XMM0_Dd_22;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),(double (*) [2])&cc0,(double (*) [2])auStack_778,
                       (double (*) [2])auStack_758);
      unique0x100009a0 = extraout_XMM0_Dc_23;
      auStack_758 = adVar5[0];
      unique0x100009a4 = extraout_XMM0_Dd_23;
    }
    cc1 = predux<double__vector(2)>((Packet2d *)auStack_678);
    cc2 = predux<double__vector(2)>((Packet2d *)auStack_698);
    cc3 = predux<double__vector(2)>((Packet2d *)auStack_6b8);
    cc4 = predux<double__vector(2)>((Packet2d *)auStack_6d8);
    cc5 = predux<double__vector(2)>((Packet2d *)auStack_6f8);
    cc6 = predux<double__vector(2)>((Packet2d *)auStack_718);
    cc7 = predux<double__vector(2)>((Packet2d *)auStack_738);
    b0_1 = predux<double__vector(2)>((Packet2d *)auStack_758);
    for (; (long)b0[1] < cols; b0[1] = (double)((long)b0[1] + 1)) {
      local_840 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data[(long)b0[1]];
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + (long)c0[1] * lVar1,&local_840);
      cc1 = dVar2 + cc1;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + ((long)c0[1] + 1) * lVar1,&local_840);
      cc2 = dVar2 + cc2;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + ((long)c0[1] + 2) * lVar1,&local_840);
      cc3 = dVar2 + cc3;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + ((long)c0[1] + 3) * lVar1,&local_840);
      cc4 = dVar2 + cc4;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + ((long)c0[1] + 4) * lVar1,&local_840);
      cc5 = dVar2 + cc5;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + ((long)c0[1] + 5) * lVar1,&local_840);
      cc6 = dVar2 + cc6;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + ((long)c0[1] + 6) * lVar1,&local_840);
      cc7 = dVar2 + cc7;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0[1] + ((long)c0[1] + 7) * lVar1,&local_840);
      b0_1 = dVar2 + b0_1;
    }
    res[(long)c0[1] * resIncr] = alpha * cc1 + res[(long)c0[1] * resIncr];
    lVar3 = ((long)c0[1] + 1) * resIncr;
    res[lVar3] = alpha * cc2 + res[lVar3];
    lVar3 = ((long)c0[1] + 2) * resIncr;
    res[lVar3] = alpha * cc3 + res[lVar3];
    lVar3 = ((long)c0[1] + 3) * resIncr;
    res[lVar3] = alpha * cc4 + res[lVar3];
    lVar3 = ((long)c0[1] + 4) * resIncr;
    res[lVar3] = alpha * cc5 + res[lVar3];
    lVar3 = ((long)c0[1] + 5) * resIncr;
    res[lVar3] = alpha * cc6 + res[lVar3];
    lVar3 = ((long)c0[1] + 6) * resIncr;
    res[lVar3] = alpha * cc7 + res[lVar3];
    lVar3 = ((long)c0[1] + 7) * resIncr;
    res[lVar3] = alpha * b0_1 + res[lVar3];
  }
  for (; (long)c0[1] < rows + -3; c0[1] = (double)((long)c0[1] + 4)) {
    local_860 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_860);
    unique0x100009c4 = extraout_XMM0_Dc_24;
    auStack_858 = adVar4[0];
    unique0x100009c8 = extraout_XMM0_Dd_24;
    local_880 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_880);
    unique0x100009e8 = extraout_XMM0_Dc_25;
    auStack_878 = adVar4[0];
    unique0x100009ec = extraout_XMM0_Dd_25;
    local_8a0 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_8a0);
    unique0x10000a0c = extraout_XMM0_Dc_26;
    auStack_898 = adVar4[0];
    unique0x10000a10 = extraout_XMM0_Dd_26;
    j_1 = 0;
    adVar4 = pset1<double__vector(2)>((double *)&j_1);
    unique0x10000a30 = extraout_XMM0_Dc_27;
    auStack_8b8 = adVar4[0];
    unique0x10000a34 = extraout_XMM0_Dd_27;
    for (b0_2[1] = 0.0; (long)b0_2[1] + 2 <= cols; b0_2[1] = (double)((long)b0_2[1] + 2)) {
      adVar4 = ploadu<double__vector(2)>
                         ((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                          (long)b0_2[1]);
      unique0x10000a54 = extraout_XMM0_Dc_28;
      auStack_8d8 = adVar4[0];
      unique0x10000a58 = extraout_XMM0_Dd_28;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0_2[1] + (long)c0[1] * lVar1);
      local_8e8[1]._0_4_ = extraout_XMM0_Dc_29;
      local_8e8[0] = adVar4[0];
      local_8e8[1]._4_4_ = extraout_XMM0_Dd_29;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_8e8,(double (*) [2])auStack_8d8,
                       (double (*) [2])auStack_858);
      unique0x10000a9c = extraout_XMM0_Dc_30;
      auStack_858 = adVar5[0];
      unique0x10000aa0 = extraout_XMM0_Dd_30;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0_2[1] + ((long)c0[1] + 1) * lVar1);
      local_8f8[1]._0_4_ = extraout_XMM0_Dc_31;
      local_8f8[0] = adVar4[0];
      local_8f8[1]._4_4_ = extraout_XMM0_Dd_31;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_8f8,(double (*) [2])auStack_8d8,
                       (double (*) [2])auStack_878);
      unique0x10000ae4 = extraout_XMM0_Dc_32;
      auStack_878 = adVar5[0];
      unique0x10000ae8 = extraout_XMM0_Dd_32;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0_2[1] + ((long)c0[1] + 2) * lVar1);
      local_908[1]._0_4_ = extraout_XMM0_Dc_33;
      local_908[0] = adVar4[0];
      local_908[1]._4_4_ = extraout_XMM0_Dd_33;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_908,(double (*) [2])auStack_8d8,
                       (double (*) [2])auStack_898);
      unique0x10000b2c = extraout_XMM0_Dc_34;
      auStack_898 = adVar5[0];
      unique0x10000b30 = extraout_XMM0_Dd_34;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0_2[1] + ((long)c0[1] + 3) * lVar1);
      unique0x10000b50 = extraout_XMM0_Dc_35;
      cc0_1 = adVar4[0];
      unique0x10000b54 = extraout_XMM0_Dd_35;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),(double (*) [2])&cc0_1,(double (*) [2])auStack_8d8,
                       (double (*) [2])auStack_8b8);
      unique0x10000b74 = extraout_XMM0_Dc_36;
      auStack_8b8 = adVar5[0];
      unique0x10000b78 = extraout_XMM0_Dd_36;
    }
    cc1_1 = predux<double__vector(2)>((Packet2d *)auStack_858);
    cc2_1 = predux<double__vector(2)>((Packet2d *)auStack_878);
    cc3_1 = predux<double__vector(2)>((Packet2d *)auStack_898);
    b0_3 = predux<double__vector(2)>((Packet2d *)auStack_8b8);
    for (; (long)b0_2[1] < cols; b0_2[1] = (double)((long)b0_2[1] + 1)) {
      local_940 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data[(long)b0_2[1]];
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0_2[1] + (long)c0[1] * lVar1,&local_940);
      cc1_1 = dVar2 + cc1_1;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0_2[1] + ((long)c0[1] + 1) * lVar1,&local_940);
      cc2_1 = dVar2 + cc2_1;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0_2[1] + ((long)c0[1] + 2) * lVar1,&local_940);
      cc3_1 = dVar2 + cc3_1;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0_2[1] + ((long)c0[1] + 3) * lVar1,&local_940);
      b0_3 = dVar2 + b0_3;
    }
    res[(long)c0[1] * resIncr] = alpha * cc1_1 + res[(long)c0[1] * resIncr];
    lVar3 = ((long)c0[1] + 1) * resIncr;
    res[lVar3] = alpha * cc2_1 + res[lVar3];
    lVar3 = ((long)c0[1] + 2) * resIncr;
    res[lVar3] = alpha * cc3_1 + res[lVar3];
    lVar3 = ((long)c0[1] + 3) * resIncr;
    res[lVar3] = alpha * b0_3 + res[lVar3];
  }
  for (; (long)c0[1] < rows + -1; c0[1] = (double)((long)c0[1] + 2)) {
    local_960 = 0.0;
    adVar4 = pset1<double__vector(2)>(&local_960);
    unique0x10000b98 = extraout_XMM0_Dc_37;
    auStack_958 = adVar4[0];
    unique0x10000b9c = extraout_XMM0_Dd_37;
    j_2 = 0;
    adVar4 = pset1<double__vector(2)>((double *)&j_2);
    unique0x10000bbc = extraout_XMM0_Dc_38;
    auStack_978 = adVar4[0];
    unique0x10000bc0 = extraout_XMM0_Dd_38;
    for (b0_4[1] = 0.0; (long)b0_4[1] + 2 <= cols; b0_4[1] = (double)((long)b0_4[1] + 2)) {
      adVar4 = ploadu<double__vector(2)>
                         ((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                          (long)b0_4[1]);
      unique0x10000be0 = extraout_XMM0_Dc_39;
      auStack_998 = adVar4[0];
      unique0x10000be4 = extraout_XMM0_Dd_39;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0_4[1] + (long)c0[1] * lVar1);
      local_9a8[1]._0_4_ = extraout_XMM0_Dc_40;
      local_9a8[0] = adVar4[0];
      local_9a8[1]._4_4_ = extraout_XMM0_Dd_40;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),&local_9a8,(double (*) [2])auStack_998,
                       (double (*) [2])auStack_958);
      unique0x10000c28 = extraout_XMM0_Dc_41;
      auStack_958 = adVar5[0];
      unique0x10000c2c = extraout_XMM0_Dd_41;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0_4[1] + ((long)c0[1] + 1) * lVar1);
      unique0x10000c4c = extraout_XMM0_Dc_42;
      cc0_2 = adVar4[0];
      unique0x10000c50 = extraout_XMM0_Dd_42;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),(double (*) [2])&cc0_2,(double (*) [2])auStack_998,
                       (double (*) [2])auStack_978);
      unique0x10000c70 = extraout_XMM0_Dc_43;
      auStack_978 = adVar5[0];
      unique0x10000c74 = extraout_XMM0_Dd_43;
    }
    cc1_2 = predux<double__vector(2)>((Packet2d *)auStack_958);
    b0_5 = predux<double__vector(2)>((Packet2d *)auStack_978);
    for (; (long)b0_4[1] < cols; b0_4[1] = (double)((long)b0_4[1] + 1)) {
      local_9d0 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data[(long)b0_4[1]];
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0_4[1] + (long)c0[1] * lVar1,&local_9d0);
      cc1_2 = dVar2 + cc1_2;
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0_4[1] + ((long)c0[1] + 1) * lVar1,&local_9d0);
      b0_5 = dVar2 + b0_5;
    }
    res[(long)c0[1] * resIncr] = alpha * cc1_2 + res[(long)c0[1] * resIncr];
    lVar3 = ((long)c0[1] + 1) * resIncr;
    res[lVar3] = alpha * b0_5 + res[lVar3];
  }
  for (; (long)c0[1] < rows; c0[1] = (double)((long)c0[1] + 1)) {
    j_3 = 0;
    adVar4 = pset1<double__vector(2)>((double *)&j_3);
    unique0x10000c94 = extraout_XMM0_Dc_44;
    auStack_9e8 = adVar4[0];
    unique0x10000c98 = extraout_XMM0_Dd_44;
    for (b0_6[1] = 0.0; (long)b0_6[1] + 2 <= cols; b0_6[1] = (double)((long)b0_6[1] + 2)) {
      adVar4 = ploadu<double__vector(2)>
                         ((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                          (long)b0_6[1]);
      unique0x10000cb8 = extraout_XMM0_Dc_45;
      auStack_a08 = adVar4[0];
      unique0x10000cbc = extraout_XMM0_Dd_45;
      adVar4 = ploadu<double__vector(2)>(_auStack_640 + (long)b0_6[1] + (long)c0[1] * lVar1);
      unique0x10000cdc = extraout_XMM0_Dc_46;
      cc0_3 = adVar4[0];
      unique0x10000ce0 = extraout_XMM0_Dd_46;
      adVar5 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
               ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                        *)((long)&n8 + 6),(double (*) [2])&cc0_3,(double (*) [2])auStack_a08,
                       (double (*) [2])auStack_9e8);
      unique0x10000d00 = extraout_XMM0_Dc_47;
      auStack_9e8 = adVar5[0];
      unique0x10000d04 = extraout_XMM0_Dd_47;
    }
    local_a20 = predux<double__vector(2)>((Packet2d *)auStack_9e8);
    for (; (long)b0_6[1] < cols; b0_6[1] = (double)((long)b0_6[1] + 1)) {
      dVar2 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&n8 + 7),
                         _auStack_640 + (long)b0_6[1] + (long)c0[1] * lVar1,
                         (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                         (long)b0_6[1]);
      local_a20 = dVar2 + local_a20;
    }
    res[(long)c0[1] * resIncr] = alpha * local_a20 + res[(long)c0[1] * resIncr];
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}